

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_reset(sqlite3_stmt *pStmt)

{
  sqlite3 *in_RDI;
  Vdbe *v;
  int rc;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  if (in_RDI == (sqlite3 *)0x0) {
    iVar1 = 0;
  }
  else {
    sqlite3_mutex_enter((sqlite3_mutex *)0x114474);
    sqlite3VdbeReset((Vdbe *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    sqlite3VdbeRewind((Vdbe *)in_RDI);
    iVar1 = sqlite3ApiExit(in_RDI,0);
    sqlite3_mutex_leave((sqlite3_mutex *)0x1144ae);
  }
  return iVar1;
}

Assistant:

SQLITE_STDCALL sqlite3_reset(sqlite3_stmt *pStmt){
  int rc;
  if( pStmt==0 ){
    rc = SQLITE_OK;
  }else{
    Vdbe *v = (Vdbe*)pStmt;
    sqlite3_mutex_enter(v->db->mutex);
    rc = sqlite3VdbeReset(v);
    sqlite3VdbeRewind(v);
    assert( (rc & (v->db->errMask))==rc );
    rc = sqlite3ApiExit(v->db, rc);
    sqlite3_mutex_leave(v->db->mutex);
  }
  return rc;
}